

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  int *piVar1;
  int iVar2;
  ImGuiStoragePair *pIVar3;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar4;
  int iVar5;
  ImGuiStoragePair *__dest;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  __dest = this->Data;
  if (__dest <= it) {
    iVar2 = this->Size;
    lVar6 = (long)iVar2;
    if (it <= __dest + lVar6) {
      lVar8 = (long)it - (long)__dest;
      if (iVar2 == this->Capacity) {
        if (iVar2 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar2 / 2 + iVar2;
        }
        iVar9 = iVar2 + 1;
        if (iVar2 + 1 < iVar5) {
          iVar9 = iVar5;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiStoragePair *)(*GImAllocatorAllocFunc)((long)iVar9 << 4,GImAllocatorUserData)
        ;
        if (this->Data != (ImGuiStoragePair *)0x0) {
          memcpy(__dest,this->Data,(long)this->Size << 4);
          pIVar3 = this->Data;
          if ((pIVar3 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
        }
        this->Data = __dest;
        this->Capacity = iVar9;
        lVar6 = (long)this->Size;
      }
      lVar7 = lVar6 - (lVar8 >> 4);
      if (lVar7 != 0 && lVar8 >> 4 <= lVar6) {
        memmove((void *)((long)__dest + lVar8 + 0x10),(void *)((long)__dest + lVar8),lVar7 * 0x10);
        __dest = this->Data;
      }
      aVar4 = v->field_1;
      *(undefined8 *)((long)__dest + lVar8) = *(undefined8 *)v;
      *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((undefined8 *)((long)__dest + lVar8) + 1)
           = aVar4;
      this->Size = this->Size + 1;
      return (ImGuiStoragePair *)(lVar8 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x549,
                "T *ImVector<ImGuiStorage::ImGuiStoragePair>::insert(const T *, const T &) [T = ImGuiStorage::ImGuiStoragePair]"
               );
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }